

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

TValue * cpluaopen(lua_State *L,lua_CFunction dummy,void *ud)

{
  global_State *g_00;
  GCtab *pGVar1;
  lua_State *L_00;
  lua_State *L_01;
  GCstr *pGVar2;
  lua_State *in_RDX;
  long in_RDI;
  global_State *g;
  lua_State *in_stack_ffffffffffffffa0;
  
  g_00 = (global_State *)(ulong)*(uint *)(in_RDI + 8);
  stack_init((lua_State *)g_00,in_stack_ffffffffffffffa0);
  pGVar1 = lj_tab_new((lua_State *)g_00,(uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      (uint32_t)in_stack_ffffffffffffffa0);
  *(int *)(in_RDI + 0x2c) = (int)pGVar1;
  L_00 = (lua_State *)((ulong)*(uint *)(in_RDI + 8) + 0x98);
  L_01 = (lua_State *)lj_tab_new((lua_State *)g_00,(uint32_t)((ulong)L_00 >> 0x20),(uint32_t)L_00);
  (L_00->nextgc).gcptr32 = (uint32_t)L_01;
  L_00->marked = 0xf4;
  L_00->gct = 0xff;
  L_00->dummy_ffid = 0xff;
  L_00->status = 0xff;
  lj_str_resize(L_01,(MSize)((ulong)in_RDI >> 0x20));
  lj_meta_init(L_00);
  lj_lex_init(in_RDX);
  pGVar2 = lj_err_str(in_RDX,(ErrMsg)((ulong)g_00 >> 0x20));
  pGVar2->marked = pGVar2->marked | 0x20;
  (g_00->gc).threshold = (g_00->gc).total << 2;
  lj_trace_initstate(g_00);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpluaopen(lua_State *L, lua_CFunction dummy, void *ud)
{
  global_State *g = G(L);
  UNUSED(dummy);
  UNUSED(ud);
  stack_init(L, L);
  /* NOBARRIER: State initialization, all objects are white. */
  setgcref(L->env, obj2gco(lj_tab_new(L, 0, LJ_MIN_GLOBAL)));
  settabV(L, registry(L), lj_tab_new(L, 0, LJ_MIN_REGISTRY));
  lj_str_resize(L, LJ_MIN_STRTAB-1);
  lj_meta_init(L);
  lj_lex_init(L);
  fixstring(lj_err_str(L, LJ_ERR_ERRMEM));  /* Preallocate memory error msg. */
  g->gc.threshold = 4*g->gc.total;
  lj_trace_initstate(g);
  return NULL;
}